

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O2

bool __thiscall spvtools::opt::LoopFissionImpl::GroupInstructionsByUseDef(LoopFissionImpl *this)

{
  undefined8 *puVar1;
  Function *pFVar2;
  pointer puVar3;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var4;
  Loop *pLVar5;
  Instruction *pIVar6;
  mapped_type_conflict mVar7;
  undefined8 inst_00;
  bool bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  BasicBlock *pBVar11;
  pointer puVar12;
  mapped_type_conflict *pmVar13;
  size_type sVar14;
  ulong uVar15;
  Instruction *inst;
  Instruction **ppIVar16;
  long lVar17;
  Instruction *inst_1;
  ulong uVar18;
  ulong uVar19;
  vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  local_b8;
  pointer local_a0;
  Instruction *local_98;
  _Rb_tree_node_base _Stack_90;
  size_t local_70;
  undefined1 local_68 [16];
  _Base_ptr local_58;
  Instruction *local_50;
  Instruction *local_48;
  Instruction *local_40;
  
  local_b8.
  super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar11 = Loop::FindConditionBlock(this->loop_);
  if (pBVar11 == (BasicBlock *)0x0) {
    bVar8 = false;
  }
  else {
    BasicBlock::tail((BasicBlock *)local_68);
    inst_00 = local_68._0_8_;
    pFVar2 = this->loop_->loop_header_->function_;
    local_50 = (Instruction *)(local_68 + 8);
    local_68._0_8_ = (Function *)0x0;
    local_68._8_8_ =
         (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          )0x0;
    local_58 = (_Base_ptr)0x0;
    local_40 = (Instruction *)0x0;
    local_48 = local_50;
    TraverseUseDef(this,(Instruction *)inst_00,
                   (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)local_68,true,true);
    puVar3 = (pFVar2->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar12 = (pFVar2->blocks_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar3;
        puVar12 = puVar12 + 1) {
      _Var4._M_head_impl =
           (puVar12->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      pLVar5 = this->loop_;
      uVar9 = BasicBlock::id(_Var4._M_head_impl);
      bVar8 = Loop::IsInsideLoop(pLVar5,uVar9);
      if (bVar8) {
        ppIVar16 = (Instruction **)((long)&(_Var4._M_head_impl)->insts_ + 0x10);
        while (pIVar6 = *ppIVar16,
              pIVar6 != (Instruction *)((long)&(_Var4._M_head_impl)->insts_ + 8U)) {
          if (pIVar6->opcode_ == OpSelectionMerge) {
LAB_002110b2:
            TraverseUseDef(this,pIVar6,
                           (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                            *)local_68,true,true);
          }
          else {
            bVar8 = Instruction::IsBranch(pIVar6);
            if (bVar8) goto LAB_002110b2;
          }
          ppIVar16 = &(pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        }
      }
    }
    local_a0 = (pFVar2->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar12 = (pFVar2->blocks_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar12 != local_a0;
        puVar12 = puVar12 + 1) {
      _Var4._M_head_impl =
           (puVar12->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      pLVar5 = this->loop_;
      uVar9 = BasicBlock::id(_Var4._M_head_impl);
      bVar8 = Loop::IsInsideLoop(pLVar5,uVar9);
      if (bVar8) {
        uVar9 = BasicBlock::id(this->loop_->loop_header_);
        uVar10 = BasicBlock::id(_Var4._M_head_impl);
        if (uVar9 != uVar10) {
          ppIVar16 = (Instruction **)((long)&(_Var4._M_head_impl)->insts_ + 0x10);
          while (pIVar6 = *ppIVar16,
                pIVar6 != (Instruction *)((long)&(_Var4._M_head_impl)->insts_ + 8U)) {
            if (pIVar6->opcode_ - OpLoad < 2) {
              mVar7 = (this->instruction_order_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
              local_98 = pIVar6;
              pmVar13 = std::
                        map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                        ::operator[](&this->instruction_order_,(key_type *)&local_98);
              *pmVar13 = mVar7;
            }
            local_98 = pIVar6;
            sVar14 = std::
                     set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                     ::count(&this->seen_instructions_,(key_type *)&local_98);
            if (sVar14 == 0) {
              local_98 = (Instruction *)0x0;
              _Stack_90._M_color = _S_red;
              _Stack_90._4_4_ = 0;
              _Stack_90._M_parent = (_Base_ptr)0x0;
              _Stack_90._M_left = &_Stack_90;
              local_70 = 0;
              _Stack_90._M_right = _Stack_90._M_left;
              TraverseUseDef(this,pIVar6,
                             (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                              *)&local_98,false,false);
              if (local_70 != 0) {
                std::
                vector<std::set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>,std::allocator<std::set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>>>
                ::
                emplace_back<std::set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>>
                          ((vector<std::set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>,std::allocator<std::set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>>>
                            *)&local_b8,
                           (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                            *)&local_98);
              }
              std::
              _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              ::~_Rb_tree((_Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                           *)&local_98);
            }
            ppIVar16 = &(pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          }
        }
      }
    }
    bVar8 = 1 < (ulong)(((long)local_b8.
                               super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_b8.
                              super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x30);
    if (bVar8) {
      lVar17 = 0x18;
      uVar18 = 0;
      while( true ) {
        uVar15 = ((long)local_b8.
                        super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b8.
                       super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x30;
        uVar19 = uVar15 >> 1;
        if (uVar19 <= uVar18) break;
        puVar1 = (undefined8 *)
                 (&((local_b8.
                     super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 + lVar17);
        std::
        _Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<spvtools::opt::Instruction*>>
                  ((_Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                    *)this,(_Base_ptr)*puVar1,(_Base_ptr)(puVar1 + -2));
        uVar18 = uVar18 + 1;
        lVar17 = lVar17 + 0x30;
      }
      lVar17 = (uVar15 >> 1) * 0x30 + 0x18;
      for (; uVar19 < (ulong)(((long)local_b8.
                                     super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_b8.
                                    super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x30);
          uVar19 = uVar19 + 1) {
        puVar1 = (undefined8 *)
                 (&((local_b8.
                     super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 + lVar17);
        std::
        _Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<spvtools::opt::Instruction*>>
                  ((_Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                    *)&this->original_loop_instructions_,(_Base_ptr)*puVar1,(_Base_ptr)(puVar1 + -2)
                  );
        lVar17 = lVar17 + 0x30;
      }
    }
    std::
    _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::~_Rb_tree((_Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)local_68);
  }
  std::
  vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  ::~vector(&local_b8);
  return bVar8;
}

Assistant:

bool LoopFissionImpl::GroupInstructionsByUseDef() {
  std::vector<std::set<Instruction*>> sets{};

  // We want to ignore all the instructions stemming from the loop condition
  // instruction.
  BasicBlock* condition_block = loop_->FindConditionBlock();

  if (!condition_block) return false;
  Instruction* condition = &*condition_block->tail();

  // We iterate over the blocks via iterating over all the blocks in the
  // function, we do this so we are iterating in the same order which the blocks
  // appear in the binary.
  Function& function = *loop_->GetHeaderBlock()->GetParent();

  // Create a temporary set to ignore certain groups of instructions within the
  // loop. We don't want any instructions related to control flow to be removed
  // from either loop only instructions within the control flow bodies.
  std::set<Instruction*> instructions_to_ignore{};
  TraverseUseDef(condition, &instructions_to_ignore, true, true);

  // Traverse control flow instructions to ensure they are added to the
  // seen_instructions_ set and will be ignored when it it called with actual
  // sets.
  for (BasicBlock& block : function) {
    if (!loop_->IsInsideLoop(block.id())) continue;

    for (Instruction& inst : block) {
      // Ignore all instructions related to control flow.
      if (inst.opcode() == spv::Op::OpSelectionMerge || inst.IsBranch()) {
        TraverseUseDef(&inst, &instructions_to_ignore, true, true);
      }
    }
  }

  // Traverse the instructions and generate the sets, automatically ignoring any
  // instructions in instructions_to_ignore.
  for (BasicBlock& block : function) {
    if (!loop_->IsInsideLoop(block.id()) ||
        loop_->GetHeaderBlock()->id() == block.id())
      continue;

    for (Instruction& inst : block) {
      // Record the order that each load/store is seen.
      if (inst.opcode() == spv::Op::OpLoad ||
          inst.opcode() == spv::Op::OpStore) {
        instruction_order_[&inst] = instruction_order_.size();
      }

      // Ignore instructions already seen in a traversal.
      if (seen_instructions_.count(&inst) != 0) {
        continue;
      }

      // Build the set.
      std::set<Instruction*> inst_set{};
      TraverseUseDef(&inst, &inst_set);
      if (!inst_set.empty()) sets.push_back(std::move(inst_set));
    }
  }

  // If we have one or zero sets return false to indicate that due to
  // insufficient instructions we couldn't split the loop into two groups and
  // thus the loop can't be split any further.
  if (sets.size() < 2) {
    return false;
  }

  // Merge the loop sets into two different sets. In CanPerformSplit we will
  // validate that we don't break the relative ordering of loads/stores by doing
  // this.
  for (size_t index = 0; index < sets.size() / 2; ++index) {
    cloned_loop_instructions_.insert(sets[index].begin(), sets[index].end());
  }
  for (size_t index = sets.size() / 2; index < sets.size(); ++index) {
    original_loop_instructions_.insert(sets[index].begin(), sets[index].end());
  }

  return true;
}